

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-sw.c
# Opt level: O1

void sha1_sw_digest(ssh_hash *hash,uint8_t *digest)

{
  ssh_hashalg *psVar1;
  size_t i;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  psVar1 = hash[-2].vt;
  uVar3 = 0x37U - *(int *)&hash[-3].binarysink_ & 0x3f;
  uVar4 = (ulong)uVar3;
  BinarySink_put_byte(hash[-1].binarysink_,0x80);
  if (uVar3 != 0) {
    do {
      BinarySink_put_byte(hash[-1].binarysink_,'\0');
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  BinarySink_put_uint64(hash[-1].binarysink_,(long)psVar1 << 3);
  if (hash[-3].binarysink_ == (BinarySink *)0x0) {
    lVar2 = 0;
    do {
      uVar3 = *(uint *)((long)&hash[-8].vt + lVar2 * 4);
      *(uint *)(digest + lVar2 * 4) =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
    return;
  }
  __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha1.h",
                0x6c,"void sha1_block_pad(sha1_block *, BinarySink *)");
}

Assistant:

static void sha1_sw_digest(ssh_hash *hash, uint8_t *digest)
{
    sha1_sw *s = container_of(hash, sha1_sw, hash);

    sha1_block_pad(&s->blk, BinarySink_UPCAST(s));
    for (size_t i = 0; i < 5; i++)
        PUT_32BIT_MSB_FIRST(digest + 4*i, s->core[i]);
}